

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void sexp_make_unblocking(sexp_conflict ctx,sexp_conflict port)

{
  sexp psVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  if ((((ulong)ctx & 3) == 0) && ((ctx->tag & 0xfffffffe) == 0x10)) {
    psVar1 = (ctx->value).type.getters;
    if (psVar1 == (sexp)0x0) {
      psVar1 = (ctx->value).type.slots;
      if (((ulong)psVar1 & 3) != 0) {
        return;
      }
      if (psVar1->tag != 0x12) {
        return;
      }
      lVar3 = (psVar1->value).fileno.fd;
    }
    else {
      iVar2 = fileno((FILE *)psVar1);
      lVar3 = (long)iVar2;
    }
    if (-1 < lVar3) {
      uVar4 = (ctx->value).port.flags;
      if (uVar4 == 0xffffffffffffffff) {
        psVar1 = (ctx->value).type.getters;
        if (psVar1 == (sexp)0x0) {
          psVar1 = (ctx->value).type.slots;
          iVar2 = -1;
          if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
            iVar2 = (psVar1->value).promise.donep;
          }
        }
        else {
          iVar2 = fileno((FILE *)psVar1);
        }
        iVar2 = fcntl(iVar2,3);
        uVar4 = (ulong)iVar2;
        (ctx->value).port.flags = uVar4;
      }
      if (((uint)uVar4 >> 0xb & 1) == 0) {
        psVar1 = (ctx->value).type.getters;
        if (psVar1 == (sexp)0x0) {
          iVar2 = -1;
          psVar1 = (ctx->value).type.slots;
          if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
            iVar2 = (psVar1->value).promise.donep;
          }
        }
        else {
          iVar2 = fileno((FILE *)psVar1);
          uVar4 = (ctx->value).port.flags;
        }
        iVar2 = fcntl(iVar2,4,uVar4 | 0x800);
        if (iVar2 == 0) {
          (ctx->value).flonum_bits[0x41] = (ctx->value).flonum_bits[0x41] | 8;
        }
      }
    }
  }
  return;
}

Assistant:

static void sexp_make_unblocking (sexp ctx, sexp port) {
  if (!(sexp_portp(port) && sexp_port_fileno(port) >= 0))
    return;
  if (sexp_port_flags(port) == SEXP_PORT_UNKNOWN_FLAGS)
    sexp_port_flags(port) = fcntl(sexp_port_fileno(port), F_GETFL);
  if (!(sexp_port_flags(port) & O_NONBLOCK))
    if (fcntl(sexp_port_fileno(port), F_SETFL, sexp_port_flags(port) | O_NONBLOCK) == 0)
      sexp_port_flags(port) |= O_NONBLOCK;
}